

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

_Bool obj_has_flag(object *obj,wchar_t flag)

{
  curse_data *pcVar1;
  _Bool _Var2;
  angband_constants *paVar3;
  _Bool _Var4;
  ulong uVar5;
  long lVar6;
  
  pcVar1 = obj->curses;
  _Var2 = flag_has_dbg(obj->flags,5,flag,"obj->flags","flag");
  _Var4 = true;
  if (!_Var2) {
    if ((pcVar1 != (curse_data *)0x0) && (1 < z_info->curse_max)) {
      uVar5 = 1;
      lVar6 = 10;
      paVar3 = z_info;
      do {
        if ((pcVar1[uVar5].power != L'\0') &&
           (_Var2 = flag_has_dbg((bitflag *)
                                 (*(long *)(curses->conflict_flags + lVar6 * 8 + -0x28) + 0x4c),5,
                                 flag,"curses[i].obj->flags","flag"), paVar3 = z_info, _Var2)) {
          return true;
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 7;
      } while (uVar5 < paVar3->curse_max);
    }
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool obj_has_flag(const struct object *obj, int flag)
{
	struct curse_data *c = obj->curses;

	/* Check the object's own flags */
	if (of_has(obj->flags, flag)) {
		return true;
	}

	/* Check any curse object flags */
	if (c) {
		int i;
		for (i = 1; i < z_info->curse_max; i++) {
			if (c[i].power && of_has(curses[i].obj->flags, flag)) {
				return true;
			}
		}
	}
	return false;
}